

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void number_suite::value_int32(void)

{
  size_type sVar1;
  UI_STRING *uis;
  char *ui;
  undefined4 local_28c;
  value local_288;
  undefined1 local_283;
  undefined1 local_282 [2];
  undefined8 local_280;
  type_conflict4 local_278;
  undefined4 local_26c;
  type_conflict3 local_268 [2];
  undefined8 local_260;
  type_conflict local_258;
  undefined4 local_24c;
  type local_248 [12];
  error *ex_7;
  error *ex_6;
  error *ex_5;
  error *ex_4;
  error *ex_3;
  type local_150 [12];
  error *ex_2;
  error *ex_1;
  error *ex;
  value local_b8 [2];
  undefined4 local_b0;
  value local_ac [6];
  undefined4 local_94;
  value local_90 [2];
  undefined1 local_88 [8];
  reader reader;
  value_type input [5];
  
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_1_ = 0;
  reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0x10000c4;
  trial::protocol::bintoken::reader::reader<unsigned_char[5]>
            ((reader *)local_88,
             (uchar (*) [5])
             ((long)&reader.stack.c.
                     super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  local_90[0] = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_94 = 0xc4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c2,"void number_suite::value_int32()",local_90,&local_94);
  local_ac[0] = trial::protocol::bintoken::reader::symbol((reader *)local_88);
  local_b0 = 4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c3,"void number_suite::value_int32()",local_ac,&local_b0);
  local_b8[0] = trial::protocol::bintoken::reader::category((reader *)local_88);
  ex._4_4_ = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c4,"void number_suite::value_int32()",local_b8,(long)&ex + 4);
  sVar1 = trial::protocol::bintoken::reader::length((reader *)local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c5,"void number_suite::value_int32()",sVar1 == 1);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::boolean>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::boolean>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1c8,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int8>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1ca,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int16>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cc,"void number_suite::value_int32()");
  local_150[0] = trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int32>
                           ((reader *)local_88);
  ex_3._4_4_ = 0x10000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32>()","0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cd,"void number_suite::value_int32()",local_150,(long)&ex_3 + 4);
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::int64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1cf,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float32>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d1,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<trial::protocol::bintoken::token::float64>
            ((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d3,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<signed_char>((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int8_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d6,"void number_suite::value_int32()");
  trial::protocol::bintoken::reader::value<short>((reader *)local_88);
  trial::protocol::core::detail::throw_failed_impl
            ("reader.value<std::int16_t>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d8,"void number_suite::value_int32()");
  local_248[0] = trial::protocol::bintoken::reader::value<int>((reader *)local_88);
  local_24c = 0x10000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<token::int32::type>()","0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1d9,"void number_suite::value_int32()",local_248,&local_24c);
  local_258 = trial::protocol::bintoken::reader::value<long>((reader *)local_88);
  local_260 = 0x10000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,unsigned_long>
            ("reader.value<token::int64::type>()","UINT64_C(0x10000)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1da,"void number_suite::value_int32()",&local_258,&local_260);
  local_268[0] = trial::protocol::bintoken::reader::value<float>((reader *)local_88);
  local_26c = 0x47800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("reader.value<token::float32::type>()","65536.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1db,"void number_suite::value_int32()",local_268,&local_26c);
  local_278 = trial::protocol::bintoken::reader::value<double>((reader *)local_88);
  local_280 = 0x40f0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("reader.value<token::float64::type>()","65536.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1dc,"void number_suite::value_int32()",&local_278,&local_280);
  local_282[0] = trial::protocol::bintoken::reader::next((reader *)local_88);
  local_283 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1dd,"void number_suite::value_int32()",local_282,&local_283);
  local_288 = trial::protocol::bintoken::reader::code((reader *)local_88);
  local_28c = 0;
  ui = "token::code::end";
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x1de,"void number_suite::value_int32()",&local_288,&local_28c);
  trial::protocol::bintoken::reader::~reader((reader *)local_88,(UI *)ui,uis);
  return;
}

Assistant:

void value_int32()
{
    const value_type input[] = { token::code::int32, 0x00, 0x00, 0x01, 0x00 };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::int32);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::boolean>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32>(), 0x10000);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int8_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<std::int16_t>(),
                                    format::error, "overflow");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int32::type>(), 0x10000);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::int64::type>(), UINT64_C(0x10000));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float32::type>(), 65536.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::float64::type>(), 65536.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}